

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

void __thiscall
despot::BaseTag::MostLikelyRobPosition
          (BaseTag *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  pointer ppSVar1;
  pointer piVar2;
  State *pSVar3;
  pointer pdVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  allocator_type local_19;
  
  if ((MostLikelyRobPosition(std::vector<despot::State*,std::allocator<despot::State*>>const&)::
       probs == '\0') && (iVar5 = __cxa_guard_acquire(), iVar5 != 0)) {
    iVar5 = despot::Floor::NumCells();
    std::vector<double,_std::allocator<double>_>::vector
              (&MostLikelyRobPosition::probs,(long)iVar5,&local_19);
    __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,&MostLikelyRobPosition::probs
                 ,&__dso_handle);
    __cxa_guard_release();
  }
  pdVar4 = MostLikelyRobPosition::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppSVar1 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 3;
    piVar2 = (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar8 = 0.0;
    lVar7 = 0;
    do {
      pSVar3 = ppSVar1[lVar7];
      iVar5 = piVar2[*(int *)(pSVar3 + 0xc)];
      dVar9 = *(double *)(pSVar3 + 0x18) + pdVar4[iVar5];
      pdVar4[iVar5] = dVar9;
      if (dVar9 <= dVar8) {
        dVar9 = dVar8;
      }
      dVar8 = dVar9;
      lVar7 = lVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  if ((long)MostLikelyRobPosition::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)MostLikelyRobPosition::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start != 0) {
    lVar6 = (long)MostLikelyRobPosition::probs.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)MostLikelyRobPosition::probs.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    memset(MostLikelyRobPosition::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start,0,(lVar6 + (ulong)(lVar6 == 0)) * 8);
  }
  despot::Floor::GetCell((int)this + 0x58);
  return;
}

Assistant:

Coord BaseTag::MostLikelyRobPosition(const vector<State*>& particles) const {
	static vector<double> probs = vector<double>(floor_.NumCells());

	double maxWeight = 0;
	int rob = -1;
	for (int i = 0; i < particles.size(); i++) {
		TagState* tagstate = static_cast<TagState*>(particles[i]);
		int id = rob_[tagstate->state_id];
		probs[id] += tagstate->weight;

		if (probs[id] > maxWeight) {
			maxWeight = probs[id];
			rob = id;
		}
	}

	for (int i = 0; i < probs.size(); i++) {
		probs[i] = 0.0;
	}

	return floor_.GetCell(rob);
}